

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.h
# Opt level: O0

void __thiscall
acto::core::message_container<msg_out,false>::message_container<char_const(&)[11]>
          (message_container<msg_out,false> *this,char (*args) [11])

{
  allocator<char> local_39;
  string local_38;
  char (*local_18) [11];
  char (*args_local) [11];
  message_container<msg_out,_false> *this_local;
  
  local_18 = args;
  args_local = (char (*) [11])this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,*args,&local_39);
  msg_out::msg_out((msg_out *)this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

constexpr message_container(Args&&... args) noexcept(
    std::is_nothrow_constructible_v<T, Args...>)
    : value_(std::forward<Args>(args)...) {
  }